

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract.c
# Opt level: O0

int archive_read_extract(archive *_a,archive_entry *entry,int flags)

{
  archive_read_extract *paVar1;
  archive *paVar2;
  archive_read *a;
  archive_read_extract *extract;
  int flags_local;
  archive_entry *entry_local;
  archive *_a_local;
  
  paVar1 = __archive_read_get_extract((archive_read *)_a);
  if (paVar1 == (archive_read_extract *)0x0) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    if (paVar1->ad == (archive *)0x0) {
      paVar2 = archive_write_disk_new();
      paVar1->ad = paVar2;
      if (paVar1->ad == (archive *)0x0) {
        archive_set_error(_a,0xc,"Can\'t extract");
        return -0x1e;
      }
      archive_write_disk_set_standard_lookup(paVar1->ad);
    }
    archive_write_disk_set_options(paVar1->ad,flags);
    _a_local._4_4_ = archive_read_extract2(_a,entry,paVar1->ad);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_extract(struct archive *_a, struct archive_entry *entry, int flags)
{
	struct archive_read_extract *extract;
	struct archive_read * a = (struct archive_read *)_a;

	extract = __archive_read_get_extract(a);
	if (extract == NULL)
		return (ARCHIVE_FATAL);

	/* If we haven't initialized the archive_write_disk object, do it now. */
	if (extract->ad == NULL) {
		extract->ad = archive_write_disk_new();
		if (extract->ad == NULL) {
			archive_set_error(&a->archive, ENOMEM, "Can't extract");
			return (ARCHIVE_FATAL);
		}
		archive_write_disk_set_standard_lookup(extract->ad);
	}

	archive_write_disk_set_options(extract->ad, flags);
	return (archive_read_extract2(&a->archive, entry, extract->ad));
}